

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O3

int lsend(lua_State *L)

{
  lua_Integer lVar1;
  char *pcVar2;
  ssize_t sVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  size_t sz;
  size_t local_38;
  
  local_38 = 0;
  lVar1 = luaL_checkinteger(L,1);
  pcVar2 = luaL_checklstring(L,2,&local_38);
  uVar5 = (uint)local_38;
  do {
    while( true ) {
      if ((int)uVar5 < 1) {
        return 0;
      }
      sVar3 = send((int)lVar1,pcVar2,(ulong)uVar5,0);
      iVar6 = (int)sVar3;
      if (iVar6 < 0) break;
      pcVar2 = pcVar2 + iVar6;
      uVar5 = uVar5 - iVar6;
    }
    piVar4 = __errno_location();
    iVar6 = *piVar4;
  } while ((iVar6 == 4) || (iVar6 == 0xb));
  pcVar2 = strerror(iVar6);
  luaL_error(L,"socket error: %s",pcVar2);
}

Assistant:

static int
lsend(lua_State *L) {
	struct skynet_context * ctx = lua_touserdata(L, lua_upvalueindex(1));
	int id = luaL_checkinteger(L, 1);
	int sz = 0;
	void *buffer = get_buffer(L, 2, &sz);
	int err = skynet_socket_send(ctx, id, buffer, sz);
	lua_pushboolean(L, !err);
	return 1;
}